

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

void print_jit_status(lua_State *L)

{
  int idx;
  int iVar1;
  char *__s;
  
  lua_getfield(L,-10000,"_LOADED");
  lua_getfield(L,-1,"jit");
  lua_remove(L,-2);
  lua_getfield(L,-1,"status");
  lua_remove(L,-2);
  idx = lua_gettop(L);
  lua_call(L,0,-1);
  iVar1 = lua_toboolean(L,idx);
  __s = "JIT: ON";
  if (iVar1 == 0) {
    __s = "JIT: OFF";
  }
  while( true ) {
    idx = idx + 1;
    fputs(__s,_stdout);
    __s = lua_tolstring(L,idx,(size_t *)0x0);
    if (__s == (char *)0x0) break;
    putc(0x20,_stdout);
  }
  putc(10,_stdout);
  return;
}

Assistant:

static void print_jit_status(lua_State *L)
{
  int n;
  const char *s;
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, -1, "jit");  /* Get jit.* module table. */
  lua_remove(L, -2);
  lua_getfield(L, -1, "status");
  lua_remove(L, -2);
  n = lua_gettop(L);
  lua_call(L, 0, LUA_MULTRET);
  fputs(lua_toboolean(L, n) ? "JIT: ON" : "JIT: OFF", stdout);
  for (n++; (s = lua_tostring(L, n)); n++) {
    putc(' ', stdout);
    fputs(s, stdout);
  }
  putc('\n', stdout);
}